

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data_table.cpp
# Opt level: O1

void __thiscall
duckdb::DataTable::InitializeScanWithOffset
          (DataTable *this,DuckTransaction *transaction,TableScanState *state,
          vector<duckdb::StorageIndex,_true> *column_ids,idx_t start_row,idx_t end_row)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  undefined8 uVar1;
  undefined8 uVar2;
  RowGroupCollection *this_01;
  undefined1 local_58 [40];
  
  shared_ptr<duckdb::DataTableInfo,_true>::operator*(&this->info);
  DuckTransaction::SharedLockTable((DuckTransaction *)local_58,(DataTableInfo *)transaction);
  uVar2 = local_58._8_8_;
  uVar1 = local_58._0_8_;
  local_58._0_8_ = (_func_int **)0x0;
  local_58._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this_00 = (state->checkpoint_lock).internal.
            super___shared_ptr<duckdb::CheckpointLock,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
  ;
  (state->checkpoint_lock).internal.
  super___shared_ptr<duckdb::CheckpointLock,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)uVar1;
  (state->checkpoint_lock).internal.
  super___shared_ptr<duckdb::CheckpointLock,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar2;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._8_8_);
  }
  ::std::vector<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>::vector
            ((vector<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_> *)
             (local_58 + 0x10),
             &column_ids->super_vector<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>)
  ;
  TableScanState::Initialize
            (state,(vector<duckdb::StorageIndex,_true> *)(local_58 + 0x10),
             (optional_ptr<duckdb::ClientContext,_true>)0x0,
             (optional_ptr<duckdb::TableFilterSet,_true>)0x0,
             (optional_ptr<duckdb::SampleOptions,_true>)0x0);
  ::std::vector<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>::~vector
            ((vector<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_> *)
             (local_58 + 0x10));
  this_01 = shared_ptr<duckdb::RowGroupCollection,_true>::operator->(&this->row_groups);
  RowGroupCollection::InitializeScanWithOffset
            (this_01,&state->table_state,column_ids,start_row,end_row);
  return;
}

Assistant:

void DataTable::InitializeScanWithOffset(DuckTransaction &transaction, TableScanState &state,
                                         const vector<StorageIndex> &column_ids, idx_t start_row, idx_t end_row) {
	state.checkpoint_lock = transaction.SharedLockTable(*info);
	state.Initialize(column_ids);
	row_groups->InitializeScanWithOffset(state.table_state, column_ids, start_row, end_row);
}